

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrepFaceField.h
# Opt level: O3

void __thiscall
anurbs::BrepFaceField<1L>::BrepFaceField(BrepFaceField<1L> *this,Ref<anurbs::BrepFace> *face)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  long lVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *peVar5;
  allocator_type local_29;
  
  peVar5 = (face->m_entry).
           super___shared_ptr<anurbs::Entry<anurbs::BrepFace>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->m_face).m_entry.
  super___shared_ptr<anurbs::Entry<anurbs::BrepFace>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
  p_Var1 = (face->m_entry).
           super___shared_ptr<anurbs::Entry<anurbs::BrepFace>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_face).m_entry.
  super___shared_ptr<anurbs::Entry<anurbs::BrepFace>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
      peVar5 = (face->m_entry).
               super___shared_ptr<anurbs::Entry<anurbs::BrepFace>,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  peVar2 = (peVar5->m_data).super___shared_ptr<anurbs::BrepFace,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (peVar5->m_data).super___shared_ptr<anurbs::BrepFace,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  lVar3 = *(long *)&(peVar2->m_geometry).m_entry.
                    super___shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
  this_00 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(peVar2->m_geometry).m_entry + 8)
            )->_M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  lVar4 = *(long *)(lVar3 + 0x28);
  this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar3 + 0x30);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  std::
  vector<Eigen::Matrix<double,_1,_1,_1,_1,_1>,_std::allocator<Eigen::Matrix<double,_1,_1,_1,_1,_1>_>_>
  ::vector(&this->m_values,*(size_type *)(lVar4 + 0x50),&local_29);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  return;
}

Assistant:

BrepFaceField(Ref<BrepFace> face) : m_face(face),
        m_values(face->surface_geometry()->nb_poles())
    { }